

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

void accumulate(vector<double,_std::allocator<double>_> *output,
               vector<double,_std::allocator<double>_> *input)

{
  pointer pdVar1;
  pointer pdVar2;
  size_t x;
  ulong uVar3;
  ulong uVar4;
  
  pdVar1 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if ((ulong)((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1) < uVar4) {
    std::vector<double,_std::allocator<double>_>::resize(output,(long)uVar4 >> 3);
    pdVar2 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar2;
  }
  for (uVar3 = 0; uVar3 < (ulong)((long)uVar4 >> 3); uVar3 = uVar3 + 1) {
    pdVar1[uVar3] = pdVar2[uVar3] + pdVar1[uVar3];
  }
  return;
}

Assistant:

void
accumulate (vector<double>& output, const vector<double>& input)
{
    if (output.size () < input.size ()) { output.resize (input.size ()); }
    for (size_t x = 0; x < input.size (); ++x)
    {
        output[x] += input[x];
    }
}